

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O3

void duckdb::NextValFunction<duckdb::NextSequenceValueOperator>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar2;
  BoundFunctionExpression *pBVar3;
  int64_t iVar4;
  ulong uVar5;
  optional_ptr<duckdb::FunctionLocalState,_true> local_28;
  
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  if ((pBVar3->bind_info).
      super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl != (FunctionData *)0x0) {
    local_28.ptr = (FunctionLocalState *)state[1]._vptr_ExpressionState;
    optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(&local_28);
    oVar2.ptr = local_28.ptr;
    Vector::SetVectorType(result,FLAT_VECTOR);
    if (args->count != 0) {
      pdVar1 = result->data;
      uVar5 = 0;
      do {
        iVar4 = SequenceCatalogEntry::NextValue
                          ((SequenceCatalogEntry *)oVar2.ptr[2]._vptr_FunctionLocalState,
                           (DuckTransaction *)oVar2.ptr[1]._vptr_FunctionLocalState);
        *(int64_t *)(pdVar1 + uVar5 * 8) = iVar4;
        uVar5 = uVar5 + 1;
      } while (uVar5 < args->count);
    }
    return;
  }
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void NextValFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	if (!func_expr.bind_info) {
		// no bind info - return null
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<NextValLocalState>();
	// sequence to use is hard coded
	// increment the sequence
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<int64_t>(result);
	for (idx_t i = 0; i < args.size(); i++) {
		// get the next value from the sequence
		result_data[i] = OP::Operation(lstate.transaction, lstate.sequence);
	}
}